

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  uint *puVar1;
  u16 uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  u32 uVar6;
  uint uVar7;
  uint uVar8;
  sqlite3_io_methods *psVar9;
  u32 *puVar10;
  u32 *aContent;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  int *piVar25;
  long lVar26;
  size_t __n;
  ht_slot *aTmp;
  long in_FS_OFFSET;
  uint *local_1e0;
  _func_int_void_ptr *local_1d0;
  long local_180;
  int isChanged;
  i64 nSize;
  u32 *puStack_130;
  undefined1 *local_128;
  ht_slot *aMerge;
  int nMerge;
  i64 nReq;
  int local_100 [50];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  isChanged = 0;
  if (pWal->readOnly != '\0') {
    iVar15 = 8;
    goto LAB_001389f3;
  }
  iVar11 = walLockExclusive(pWal,1,1);
  iVar17 = eMode;
  if (iVar11 == 0) {
    pWal->ckptLock = '\x01';
    local_1d0 = xBusy;
    if (eMode == 0) {
      iVar17 = 0;
LAB_00138967:
      iVar11 = walIndexReadHdr(pWal,&isChanged);
      xBusy = local_1d0;
      if (isChanged != 0) {
        psVar9 = pWal->pDbFd->pMethods;
        if (2 < psVar9->iVersion) {
          (*psVar9->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
        }
      }
    }
    else {
      iVar11 = walBusyLock(pWal,xBusy,pBusyArg,0,1);
      if (iVar11 == 5) {
        iVar17 = 0;
        local_1d0 = (_func_int_void_ptr *)0x0;
        goto LAB_00138967;
      }
      if (iVar11 == 0) {
        pWal->writeLock = '\x01';
        goto LAB_00138967;
      }
    }
    if (iVar11 == 0) {
      uVar16 = (pWal->hdr).mxFrame;
      uVar2 = (pWal->hdr).szPage;
      uVar19 = CONCAT22(uVar2,uVar2) & 0x1fe00;
      if ((uVar16 == 0) || (uVar19 == nBuf)) {
        puVar10 = *pWal->apWiData;
        if (puVar10[0x18] < uVar16) {
          uVar4 = (pWal->hdr).nPage;
          iVar11 = 0;
          for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
            uVar5 = puVar10[lVar23 + 0x1a];
            if (uVar5 < uVar16) {
              iVar15 = (int)lVar23 + 4;
              iVar11 = walBusyLock(pWal,xBusy,pBusyArg,iVar15,1);
              if (iVar11 == 5) {
                xBusy = (_func_int_void_ptr *)0x0;
                uVar16 = uVar5;
              }
              else {
                if (iVar11 != 0) {
                  local_1e0 = (uint *)0x0;
                  goto LAB_00139316;
                }
                puVar10[lVar23 + 0x1a] = -(uint)(lVar23 != 0) | uVar16;
                walUnlockExclusive(pWal,iVar15,1);
                iVar11 = 0;
              }
            }
          }
          if (uVar16 <= puVar10[0x18]) {
            local_1e0 = (uint *)0x0;
LAB_00139275:
            iVar15 = 0;
            if (iVar11 != 5) {
              iVar15 = iVar11;
            }
            goto LAB_00139280;
          }
          uVar6 = puVar10[0x18];
          uVar5 = (pWal->hdr).mxFrame;
          uVar24 = (ulong)(uVar5 + 0x1000) + 0xffffffff021 >> 0xc;
          lVar23 = uVar24 << 0x20;
          lVar26 = lVar23 >> 0x1b;
          uVar20 = 0x1000;
          if (uVar5 < 0x1000) {
            uVar20 = uVar5;
          }
          local_1e0 = (uint *)sqlite3_malloc64(lVar26 + (ulong)uVar5 * 2 + (ulong)uVar20 * 2 + 0x28)
          ;
          if (local_1e0 != (uint *)0x0) {
            iVar11 = 0;
            __n = lVar26 + (ulong)uVar5 * 2 + 0x28;
            memset(local_1e0,0,__n);
            local_1e0[1] = (int)uVar24 + 1;
            aTmp = (ht_slot *)(__n + (long)local_1e0);
            lVar23 = lVar23 >> 0x20;
            for (local_180 = (long)((ulong)(uVar6 + 0x1001) * 0x100000 + -0xfdf00000) >> 0x20;
                (iVar11 == 0 && (local_180 <= lVar23)); local_180 = local_180 + 1) {
              local_128 = &DAT_aaaaaaaaaaaaaaaa;
              nSize = (i64)&DAT_aaaaaaaaaaaaaaaa;
              puStack_130 = (u32 *)&DAT_aaaaaaaaaaaaaaaa;
              iVar11 = walHashGet(pWal,(int)local_180,(WalHashLoc *)&nSize);
              aContent = puStack_130;
              if (iVar11 == 0) {
                if (local_180 == lVar23) {
                  uVar24 = (ulong)(uVar5 - (u32)local_128);
                }
                else {
                  uVar24 = (ulong)(nSize - (long)puStack_130) >> 2;
                }
                lVar26 = (long)local_1e0 +
                         ((ulong)local_128 & 0xffffffff) * 2 + (long)(int)local_1e0[1] * 0x20 + 8;
                uVar20 = (u32)local_128 + 1;
                local_128 = (undefined1 *)CONCAT44(local_128._4_4_,uVar20);
                uVar12 = 0;
                if (0 < (int)(uint)uVar24) {
                  uVar12 = uVar24 & 0xffffffff;
                }
                for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
                  *(short *)(lVar26 + uVar13 * 2) = (short)uVar13;
                }
                nMerge = 0;
                aMerge = (ht_slot *)0x0;
                memset(&nReq,0,0xd0);
                uVar22 = 0;
                for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
                  nMerge = 1;
                  aMerge = (ht_slot *)(lVar26 + uVar13 * 2);
                  for (uVar22 = 0; uVar14 = (ulong)uVar22,
                      ((uint)uVar13 >> (uVar22 & 0x1f) & 1) != 0; uVar22 = uVar22 + 1) {
                    walMerge(aContent,*(ht_slot **)(local_100 + uVar14 * 4),
                             local_100[(uVar14 * 2 + -1) * 2],&aMerge,&nMerge,aTmp);
                  }
                  *(ht_slot **)(local_100 + uVar14 * 4) = aMerge;
                  local_100[(uVar14 * 2 + -1) * 2] = nMerge;
                }
                uVar12 = (ulong)(uVar22 + 1);
                piVar25 = local_100 + uVar12 * 4;
                while (uVar22 = (uint)uVar12, uVar22 < 0xd) {
                  if (((uint)uVar24 >> (uVar22 & 0x1f) & 1) != 0) {
                    walMerge(aContent,*(ht_slot **)piVar25,piVar25[-2],&aMerge,&nMerge,aTmp);
                  }
                  piVar25 = piVar25 + 4;
                  uVar12 = (ulong)(uVar22 + 1);
                }
                local_1e0[local_180 * 8 + 9] = uVar20;
                local_1e0[local_180 * 8 + 8] = nMerge;
                *(long *)(local_1e0 + local_180 * 8 + 4) = lVar26;
                *(u32 **)(local_1e0 + local_180 * 8 + 6) = aContent;
              }
            }
            if (iVar11 == 0) {
              iVar11 = walBusyLock(pWal,xBusy,pBusyArg,3,1);
              if (iVar11 == 0) {
                uVar5 = puVar10[0x18];
                puVar10[0x20] = uVar16;
                uVar24 = (ulong)uVar19;
                uVar20 = (uint)sync_flags >> 2 & 3;
                if ((uVar20 == 0) ||
                   (iVar15 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar20), iVar15 == 0)) {
                  nReq = uVar4 * uVar24;
                  nSize = (i64)&DAT_aaaaaaaaaaaaaaaa;
                  (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,0x27,(void *)0x0);
                  iVar15 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,&nSize);
                  if (iVar15 == 0) {
                    if (nSize < nReq) {
                      if ((long)(nSize + (pWal->hdr).mxFrame * uVar24 + 0x10000) < nReq) {
                        iVar15 = sqlite3CorruptError(0x1074b);
                      }
                      else {
                        psVar9 = pWal->pDbFd->pMethods;
                        if (psVar9 != (sqlite3_io_methods *)0x0) {
                          (*psVar9->xFileControl)(pWal->pDbFd,5,&nReq);
                        }
                        iVar15 = 0;
                      }
                    }
                    else {
                      iVar15 = 0;
                    }
                  }
                }
                uVar22 = 0;
                while (iVar11 = iVar15, iVar11 == 0) {
                  uVar7 = *local_1e0;
                  uVar12 = (ulong)local_1e0[1];
                  uVar18 = 0xffffffff;
LAB_00139088:
                  if (0 < (int)uVar12) {
                    uVar12 = uVar12 - 1;
                    puVar1 = local_1e0 + uVar12 * 8 + 2;
                    uVar21 = local_1e0[uVar12 * 8 + 2];
                    for (lVar23 = (long)(int)uVar21; uVar21 = uVar21 + 1,
                        lVar23 < (int)local_1e0[uVar12 * 8 + 8]; lVar23 = lVar23 + 1) {
                      uVar3 = *(ushort *)(*(long *)(puVar1 + 2) + lVar23 * 2);
                      uVar8 = *(uint *)(*(long *)(puVar1 + 4) + (ulong)uVar3 * 4);
                      if (uVar7 < uVar8) {
                        if (uVar8 < uVar18) {
                          uVar22 = (uint)uVar3 + puVar1[7];
                          uVar18 = uVar8;
                        }
                        break;
                      }
                      *puVar1 = uVar21;
                    }
                    goto LAB_00139088;
                  }
                  *local_1e0 = uVar18;
                  if (uVar18 == 0xffffffff) {
                    iVar11 = 0;
                    break;
                  }
                  if ((db->u1).isInterrupted != 0) {
                    iVar11 = (uint)(db->mallocFailed == '\0') * 2 + 7;
                    break;
                  }
                  iVar15 = 0;
                  if ((((uVar5 < uVar22) && (uVar22 <= uVar16)) && (uVar18 <= uVar4)) &&
                     ((iVar11 = (*pWal->pWalFd->pMethods->xRead)
                                          (pWal->pWalFd,zBuf,uVar19,
                                           (ulong)(uVar22 - 1) * (ulong)(uVar19 | 0x18) + 0x38),
                      iVar11 != 0 ||
                      (iVar11 = (*pWal->pDbFd->pMethods->xWrite)
                                          (pWal->pDbFd,zBuf,uVar19,(uVar18 - 1) * uVar24),
                      iVar11 != 0)))) break;
                }
                psVar9 = pWal->pDbFd->pMethods;
                if (psVar9 != (sqlite3_io_methods *)0x0) {
                  (*psVar9->xFileControl)(pWal->pDbFd,0x25,(void *)0x0);
                }
                if ((iVar11 == 0) &&
                   ((uVar16 != (*pWal->apWiData)[4] ||
                    ((iVar11 = (*pWal->pDbFd->pMethods->xTruncate)
                                         (pWal->pDbFd,uVar24 * (pWal->hdr).nPage), iVar11 == 0 &&
                     ((uVar20 == 0 ||
                      (iVar11 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar20), iVar11 == 0))))
                    )))) {
                  puVar10[0x18] = uVar16;
                  iVar11 = 0;
                }
                walUnlockExclusive(pWal,3,1);
              }
            }
            else {
              sqlite3_free(local_1e0);
              local_1e0 = (uint *)0x0;
            }
            goto LAB_00139275;
          }
          local_1e0 = (uint *)0x0;
          iVar11 = 7;
        }
        else {
          local_1e0 = (uint *)0x0;
          iVar15 = 0;
LAB_00139280:
          iVar11 = iVar15;
          if ((((iVar17 != 0) && (iVar15 == 0)) &&
              (iVar11 = 5, (pWal->hdr).mxFrame <= puVar10[0x18])) && (iVar11 = 0, 1 < iVar17)) {
            nReq = CONCAT44(nReq._4_4_,0xaaaaaaaa);
            sqlite3_randomness(4,&nReq);
            iVar11 = walBusyLock(pWal,xBusy,pBusyArg,4,4);
            if (iVar11 == 0) {
              iVar11 = 0;
              if (iVar17 == 3) {
                walRestartHdr(pWal,(u32)nReq);
                iVar11 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
              }
              walUnlockExclusive(pWal,4,4);
            }
          }
        }
LAB_00139316:
        sqlite3_free(local_1e0);
      }
      else {
        iVar11 = sqlite3CorruptError(0x10f64);
      }
      if ((iVar11 == 5) || (iVar11 == 0)) {
        if (pnLog != (int *)0x0) {
          *pnLog = (pWal->hdr).mxFrame;
        }
        if (pnCkpt != (int *)0x0) {
          *pnCkpt = (*pWal->apWiData)[0x18];
        }
      }
    }
  }
  if (isChanged != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->ckptLock != '\0') {
    walUnlockExclusive(pWal,1,1);
    pWal->ckptLock = '\0';
  }
  iVar15 = 5;
  if (iVar11 != 0) {
    iVar15 = iVar11;
  }
  if (iVar17 == eMode) {
    iVar15 = iVar11;
  }
LAB_001389f3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. */
  sqlite3WalDb(pWal, db);
  if( xBusy2 ) (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  SEH_TRY {
    if( rc==SQLITE_OK ){
      /* For a passive checkpoint, do not re-enable blocking locks after
      ** reading the wal-index header. A passive checkpoint should not block
      ** or invoke the busy handler. The only lock such a checkpoint may
      ** attempt to obtain is a lock on a read-slot, and it should give up
      ** immediately and do a partial checkpoint if it cannot obtain it. */
      walDisableBlocking(pWal);
      rc = walIndexReadHdr(pWal, &isChanged);
      if( eMode2!=SQLITE_CHECKPOINT_PASSIVE ) (void)walEnableBlocking(pWal);
      if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
        sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
      }
    }

    /* Copy data from the log to the database file. */
    if( rc==SQLITE_OK ){
      if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags,zBuf);
      }

      /* If no error occurred, set the output variables. */
      if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
        if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
        SEH_INJECT_FAULT;
        if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
      }
    }
  }
  SEH_EXCEPT( rc = walHandleException(pWal); )

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}